

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

BasicHeapType __thiscall wasm::HeapType::getUnsharedBottom(HeapType *this)

{
  BasicHeapType BVar1;
  uint uVar2;
  HeapTypeInfo *pHVar3;
  undefined *puVar4;
  HeapType ht;
  
  ht = (HeapType)this->id;
  if (ht.id < 0x7d) {
    BVar1 = getBasic(this,Unshared);
    uVar2 = BVar1 << 0x1d | BVar1 - ext >> 3;
    if (uVar2 < 0xf) {
      puVar4 = &DAT_00e5b78c;
      goto LAB_00cfa62e;
    }
    ht = (HeapType)this->id;
  }
  pHVar3 = anon_unknown_0::getHeapTypeInfo(ht);
  uVar2 = pHVar3->kind - Func;
  if (3 < uVar2) {
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x457);
  }
  puVar4 = &DAT_00e5b8a0;
LAB_00cfa62e:
  return *(BasicHeapType *)(puVar4 + (ulong)uVar2 * 4);
}

Assistant:

HeapType::BasicHeapType HeapType::getUnsharedBottom() const {
  if (isBasic()) {
    switch (getBasic(Unshared)) {
      case ext:
        return noext;
      case func:
        return nofunc;
      case cont:
        return nocont;
      case exn:
        return noexn;
      case any:
      case eq:
      case i31:
      case struct_:
      case array:
      case none:
        return none;
      case string:
      case noext:
        return noext;
      case nofunc:
        return nofunc;
      case nocont:
        return nocont;
      case noexn:
        return noexn;
    }
  }
  auto* info = getHeapTypeInfo(*this);
  switch (info->kind) {
    case HeapTypeKind::Func:
      return nofunc;
    case HeapTypeKind::Cont:
      return nocont;
    case HeapTypeKind::Struct:
    case HeapTypeKind::Array:
      return none;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}